

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O3

void KYBER_decap(uint8_t *out_shared_secret,uint8_t *ciphertext,KYBER_private_key *private_key)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  unkbyte10 Var8;
  byte bVar9;
  uint16_t uVar10;
  int i;
  int iVar11;
  long lVar12;
  long lVar13;
  scalar *out;
  uint16_t *out_00;
  int i_1;
  ushort uVar14;
  uint uVar15;
  uint uVar16;
  ushort uVar21;
  ushort uVar22;
  undefined1 auVar18 [12];
  undefined1 auVar20 [16];
  uint uVar25;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uint uVar28;
  undefined4 uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar37 [16];
  uint8_t decrypted [64];
  uint8_t prekey_and_randomness [64];
  uint8_t input [64];
  uint8_t expected_ciphertext [1088];
  byte local_a68 [32];
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined4 local_a28;
  undefined4 uStack_a24;
  undefined4 uStack_a20;
  undefined4 uStack_a1c;
  uint8_t local_a08 [480];
  scalar local_828;
  vector local_628;
  undefined1 auVar17 [12];
  undefined1 auVar19 [16];
  
  out = local_628.v;
  vector_decode((vector *)out,ciphertext,10);
  lVar12 = 0;
  do {
    lVar13 = 0;
    do {
      auVar26 = *(undefined1 (*) [16])(((scalar *)out->c)->c + lVar13);
      auVar23 = pmulhuw(auVar26,_DAT_0023a190);
      uVar14 = auVar26._0_2_ * (short)DAT_0023a190;
      uVar21 = auVar26._6_2_ * DAT_0023a190._6_2_;
      uVar22 = auVar26._8_2_ * DAT_0023a190._8_2_;
      uVar16 = CONCAT22(auVar23._6_2_,uVar21);
      Var8 = CONCAT64(CONCAT42(uVar16,auVar23._4_2_),
                      CONCAT22(auVar26._4_2_ * DAT_0023a190._4_2_,uVar21));
      auVar6._4_8_ = (long)((unkuint10)Var8 >> 0x10);
      auVar6._2_2_ = auVar23._2_2_;
      auVar6._0_2_ = auVar26._2_2_ * DAT_0023a190._2_2_;
      uVar15 = CONCAT22(auVar23._8_2_,uVar22);
      auVar17._0_8_ = CONCAT26(auVar23._10_2_,CONCAT24(auVar26._10_2_ * DAT_0023a190._10_2_,uVar15))
      ;
      auVar17._8_2_ = auVar26._12_2_ * DAT_0023a190._12_2_;
      auVar17._10_2_ = auVar23._12_2_;
      auVar26._12_2_ = auVar26._14_2_ * DAT_0023a190._14_2_;
      auVar26._0_12_ = auVar17;
      auVar26._14_2_ = auVar23._14_2_;
      uVar25 = (uint)((ulong)auVar17._0_8_ >> 0x20);
      uVar28 = (uint)((unkuint10)Var8 >> 0x10);
      auVar24._0_4_ = (int)((((uVar22 & 0x200) >> 9) + (uVar15 >> 10)) * 0x10000) >> 0x10;
      auVar24._4_4_ = (int)(((uVar25 >> 9 & 1) + (uVar25 >> 10)) * 0x10000) >> 0x10;
      auVar24._8_4_ = (int)(((auVar17._8_4_ >> 9 & 1) + (auVar17._8_4_ >> 10)) * 0x10000) >> 0x10;
      auVar24._12_4_ = (int)(((auVar26._12_4_ >> 9 & 1) + (auVar26._12_4_ >> 10)) * 0x10000) >> 0x10
      ;
      auVar23._0_4_ =
           (int)((((uVar14 & 0x200) >> 9) + (CONCAT22(auVar23._0_2_,uVar14) >> 10)) * 0x10000) >>
           0x10;
      auVar23._4_4_ = (int)(((auVar6._0_4_ >> 9 & 1) + (auVar6._0_4_ >> 10)) * 0x10000) >> 0x10;
      auVar23._8_4_ = (int)(((uVar28 >> 9 & 1) + (uVar28 >> 10)) * 0x10000) >> 0x10;
      auVar23._12_4_ = (int)((((uVar21 & 0x200) >> 9) + (uVar16 >> 10)) * 0x10000) >> 0x10;
      auVar26 = packssdw(auVar23,auVar24);
      *(undefined1 (*) [16])(((scalar *)out->c)->c + lVar13) = auVar26;
      lVar13 = lVar13 + 8;
    } while (lVar13 != 0x100);
    lVar12 = lVar12 + 1;
    out = out + 1;
  } while (lVar12 != 3);
  vector_ntt(&local_628);
  out_00 = (uint16_t *)&local_a28;
  scalar_decode((scalar *)out_00,ciphertext + 0x3c0,4);
  lVar12 = 0;
  do {
    auVar26 = *(undefined1 (*) [16])((long)&local_a28 + lVar12 * 2);
    auVar24 = pmulhuw(auVar26,_DAT_0023a190);
    uVar14 = auVar26._0_2_ * (short)DAT_0023a190;
    uVar21 = auVar26._6_2_ * DAT_0023a190._6_2_;
    uVar22 = auVar26._8_2_ * DAT_0023a190._8_2_;
    uVar16 = CONCAT22(auVar24._6_2_,uVar21);
    Var8 = CONCAT64(CONCAT42(uVar16,auVar24._4_2_),
                    CONCAT22(auVar26._4_2_ * DAT_0023a190._4_2_,uVar21));
    auVar7._4_8_ = (long)((unkuint10)Var8 >> 0x10);
    auVar7._2_2_ = auVar24._2_2_;
    auVar7._0_2_ = auVar26._2_2_ * DAT_0023a190._2_2_;
    uVar15 = CONCAT22(auVar24._8_2_,uVar22);
    auVar18._0_8_ = CONCAT26(auVar24._10_2_,CONCAT24(auVar26._10_2_ * DAT_0023a190._10_2_,uVar15));
    auVar18._8_2_ = auVar26._12_2_ * DAT_0023a190._12_2_;
    auVar18._10_2_ = auVar24._12_2_;
    auVar19._12_2_ = auVar26._14_2_ * DAT_0023a190._14_2_;
    auVar19._0_12_ = auVar18;
    auVar19._14_2_ = auVar24._14_2_;
    uVar25 = (uint)((ulong)auVar18._0_8_ >> 0x20);
    uVar28 = (uint)((unkuint10)Var8 >> 0x10);
    auVar20._0_4_ = (int)((((uVar22 & 8) >> 3) + (uVar15 >> 4)) * 0x10000) >> 0x10;
    auVar20._4_4_ = (int)(((uVar25 >> 3 & 1) + (uVar25 >> 4)) * 0x10000) >> 0x10;
    auVar20._8_4_ = (int)(((auVar18._8_4_ >> 3 & 1) + (auVar18._8_4_ >> 4)) * 0x10000) >> 0x10;
    auVar20._12_4_ = (int)(((auVar19._12_4_ >> 3 & 1) + (auVar19._12_4_ >> 4)) * 0x10000) >> 0x10;
    auVar27._0_4_ =
         (int)((((uVar14 & 8) >> 3) + (CONCAT22(auVar24._0_2_,uVar14) >> 4)) * 0x10000) >> 0x10;
    auVar27._4_4_ = (int)(((auVar7._0_4_ >> 3 & 1) + (auVar7._0_4_ >> 4)) * 0x10000) >> 0x10;
    auVar27._8_4_ = (int)(((uVar28 >> 3 & 1) + (uVar28 >> 4)) * 0x10000) >> 0x10;
    auVar27._12_4_ = (int)((((uVar21 & 8) >> 3) + (uVar16 >> 4)) * 0x10000) >> 0x10;
    auVar26 = packssdw(auVar27,auVar20);
    *(undefined1 (*) [16])((long)&local_a28 + lVar12 * 2) = auVar26;
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0x100);
  scalar_inner_product(&local_828,(vector *)((long)&private_key->opaque + 0x1840),&local_628);
  scalar_inverse_ntt(&local_828);
  lVar12 = 0;
  do {
    uVar10 = reduce_once((*(short *)((long)&local_a28 + lVar12 * 2) - local_828.c[lVar12]) + 0xd01);
    *(uint16_t *)((long)&local_a28 + lVar12 * 2) = uVar10;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x100);
  scalar_compress((scalar *)out_00,1);
  lVar12 = 0;
  do {
    uVar14 = *out_00 & 1;
    uVar21 = (out_00[1] & 1) * 2;
    uVar22 = (out_00[2] & 1) * 4;
    uVar32 = (out_00[3] & 1) * 8;
    uVar33 = (out_00[4] & 1) * 0x10;
    uVar34 = (out_00[5] & 1) * 0x20;
    uVar35 = (out_00[6] & 1) * 0x40;
    uVar36 = (out_00[7] & 1) * 0x80;
    auVar29._0_8_ =
         CONCAT17(((out_00[7] & 1) != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36),
                  CONCAT16(((out_00[6] & 1) != 0) * (uVar35 < 0x100) * (char)uVar35 -
                           (0xff < uVar35),
                           CONCAT15(((out_00[5] & 1) != 0) * (uVar34 < 0x100) * (char)uVar34 -
                                    (0xff < uVar34),
                                    CONCAT14(((out_00[4] & 1) != 0) * (uVar33 < 0x100) *
                                             (char)uVar33 - (0xff < uVar33),
                                             CONCAT13(((out_00[3] & 1) != 0) * (uVar32 < 0x100) *
                                                      (char)uVar32 - (0xff < uVar32),
                                                      CONCAT12(((out_00[2] & 1) != 0) *
                                                               (uVar22 < 0x100) * (char)uVar22 -
                                                               (0xff < uVar22),
                                                               CONCAT11(((out_00[1] & 1) != 0) *
                                                                        (uVar21 < 0x100) *
                                                                        (char)uVar21 -
                                                                        (0xff < uVar21),
                                                                        (uVar14 != 0) *
                                                                        (uVar14 < 0x100) *
                                                                        (char)uVar14 -
                                                                        (0xff < uVar14))))))));
    auVar29._8_8_ = 0;
    uVar31 = (undefined4)(auVar29._0_8_ >> 0x20);
    auVar37._4_4_ = uVar31;
    auVar37._0_4_ = uVar31;
    auVar37._8_4_ = uVar31;
    auVar37._12_4_ = uVar31;
    auVar37 = auVar37 | auVar29;
    auVar30._0_4_ = auVar37._0_4_ >> 0x10;
    auVar30._4_4_ = 0;
    auVar30._8_4_ = auVar37._8_4_ >> 0x10;
    auVar30._12_4_ = auVar37._12_4_ >> 0x10;
    local_a68[lVar12] = SUB161(auVar30 | auVar37,1) | SUB161(auVar30 | auVar37,0);
    lVar12 = lVar12 + 1;
    out_00 = out_00 + 8;
  } while (lVar12 != 0x20);
  local_a48 = *(undefined8 *)((long)&private_key->opaque + 0x620);
  uStack_a40 = *(undefined8 *)((long)&private_key->opaque + 0x628);
  local_a38 = *(undefined8 *)((long)&private_key->opaque + 0x630);
  uStack_a30 = *(undefined8 *)((long)&private_key->opaque + 0x638);
  BORINGSSL_keccak((uint8_t *)&local_a28,0x40,local_a68,0x40,boringssl_sha3_512);
  encrypt_cpa((uint8_t *)&local_628,(public_key *)private_key,local_a68,local_a08);
  iVar11 = CRYPTO_memcmp(ciphertext,&local_628,0x440);
  lVar12 = 0;
  bVar9 = 0xff;
  if (iVar11 != 0) {
    bVar9 = 0;
  }
  auVar26 = pshuflw(ZEXT216(CONCAT11(bVar9,bVar9)),ZEXT216(CONCAT11(bVar9,bVar9)),0);
  uVar16 = auVar26._0_4_;
  auVar26 = ZEXT216(CONCAT11(~bVar9,~bVar9));
  auVar26 = pshuflw(auVar26,auVar26,0);
  uVar15 = auVar26._0_4_;
  do {
    puVar1 = (uint *)((long)&private_key->opaque + lVar12 + 0x1e40);
    uVar25 = puVar1[1];
    uVar28 = puVar1[2];
    uVar2 = puVar1[3];
    uVar3 = *(uint *)((long)&uStack_a24 + lVar12);
    uVar4 = *(uint *)((long)&uStack_a20 + lVar12);
    uVar5 = *(uint *)((long)&uStack_a1c + lVar12);
    *(uint *)((long)local_828.c + lVar12) =
         *(uint *)((long)&local_a28 + lVar12) & uVar16 | *puVar1 & uVar15;
    *(uint *)((long)local_828.c + lVar12 + 4) = uVar3 & uVar16 | uVar25 & uVar15;
    *(uint *)((long)local_828.c + lVar12 + 8) = uVar4 & uVar16 | uVar28 & uVar15;
    *(uint *)((long)local_828.c + lVar12 + 0xc) = uVar5 & uVar16 | uVar2 & uVar15;
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x20);
  BORINGSSL_keccak((uint8_t *)(local_828.c + 0x10),0x20,ciphertext,0x440,boringssl_sha3_256);
  BORINGSSL_keccak(out_shared_secret,0x20,(uint8_t *)&local_828,0x40,boringssl_shake256);
  return;
}

Assistant:

void KYBER_decap(uint8_t out_shared_secret[KYBER_SHARED_SECRET_BYTES],
                 const uint8_t ciphertext[KYBER_CIPHERTEXT_BYTES],
                 const struct KYBER_private_key *private_key) {
  const struct private_key *priv = private_key_from_external(private_key);
  uint8_t decrypted[64];
  decrypt_cpa(decrypted, priv, ciphertext);
  OPENSSL_memcpy(decrypted + 32, priv->pub.public_key_hash,
                 sizeof(decrypted) - 32);
  uint8_t prekey_and_randomness[64];
  hash_g(prekey_and_randomness, decrypted, sizeof(decrypted));
  uint8_t expected_ciphertext[KYBER_CIPHERTEXT_BYTES];
  encrypt_cpa(expected_ciphertext, &priv->pub, decrypted,
              prekey_and_randomness + 32);
  uint8_t mask =
      constant_time_eq_int_8(CRYPTO_memcmp(ciphertext, expected_ciphertext,
                                           sizeof(expected_ciphertext)),
                             0);
  uint8_t input[64];
  for (int i = 0; i < 32; i++) {
    input[i] = constant_time_select_8(mask, prekey_and_randomness[i],
                                      priv->fo_failure_secret[i]);
  }
  hash_h(input + 32, ciphertext, KYBER_CIPHERTEXT_BYTES);
  kdf(out_shared_secret, KYBER_SHARED_SECRET_BYTES, input, sizeof(input));
}